

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_verify.c
# Opt level: O3

int main(int argc,char **argv)

{
  yajl_status yVar1;
  int iVar2;
  yajl_handle h;
  size_t sVar3;
  ulong extraout_RAX;
  uint uVar4;
  yajl_option opt;
  yajl_option yVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  h = yajl_alloc((yajl_callbacks *)0x0,(yajl_alloc_funcs *)0x0,(void *)0x0);
  bVar9 = true;
  if (1 < argc) {
    uVar8 = 1;
    opt = 0;
    do {
      pcVar6 = argv[uVar8];
      if ((*pcVar6 != '-') || (sVar3 = strlen(pcVar6), sVar3 < 2)) {
LAB_00102501:
        uVar4 = (uint)argv;
        main_cold_1();
        if (2 < uVar4) {
          return 0x105139;
        }
        return *(int *)(&DAT_00105170 + (ulong)uVar4 * 4) + 0x105170;
      }
      uVar7 = 1;
      uVar4 = 2;
      yVar5 = opt;
      do {
        opt = yajl_allow_comments;
        switch((int)pcVar6[uVar7] - 99U >> 1 | (uint)(((int)pcVar6[uVar7] - 99U & 1) != 0) << 0x1f)
        {
        case 0:
          break;
        default:
          main_cold_4();
          goto LAB_00102501;
        case 7:
          goto switchD_001023b6_caseD_7;
        case 8:
          opt = yajl_allow_multiple_values;
          break;
        case 9:
          opt = yajl_dont_validate_strings;
        }
        yajl_config(h,opt,1);
        opt = yVar5;
switchD_001023b6_caseD_7:
        uVar7 = (ulong)uVar4;
        pcVar6 = argv[uVar8];
        sVar3 = strlen(pcVar6);
        uVar4 = uVar4 + 1;
        yVar5 = opt;
      } while (uVar7 < sVar3);
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)argc);
    bVar9 = opt == 0;
  }
  do {
    sVar3 = fread(main::fileData,1,0xffff,_stdin);
    if (sVar3 == 0) {
      iVar2 = feof(_stdin);
      if (iVar2 == 0) {
        if (bVar9) {
          main_cold_2();
          if ((extraout_RAX & 1) == 0) goto LAB_00102471;
          goto LAB_001024bd;
        }
        yajl_complete_parse(h);
        goto LAB_001024a5;
      }
      break;
    }
    main::fileData[sVar3] = '\0';
    yVar1 = yajl_parse(h,main::fileData,sVar3);
  } while (yVar1 == yajl_status_ok);
  yVar1 = yajl_complete_parse(h);
  if (yVar1 == yajl_status_ok) {
    yajl_free(h);
    iVar2 = 0;
    if (!bVar9) {
      return 0;
    }
    pcVar6 = "valid";
  }
  else {
    if (!bVar9) {
LAB_001024a5:
      yajl_free(h);
      return 1;
    }
LAB_00102471:
    main_cold_3();
LAB_001024bd:
    yajl_free(h);
    pcVar6 = "invalid";
    iVar2 = 1;
  }
  printf("JSON is %s\n",pcVar6);
  return iVar2;
}

Assistant:

int
main(int argc, char ** argv)
{
    yajl_status stat;
    size_t rd;
    yajl_handle hand;
    static unsigned char fileData[65536];
    int quiet = 0;
    int retval = 0;
    int a = 1;

    /* allocate a parser */
    hand = yajl_alloc(NULL, NULL, NULL);

    /* check arguments.*/
    while ((a < argc) && (argv[a][0] == '-') && (strlen(argv[a]) > 1)) {
        unsigned int i;
        for ( i=1; i < strlen(argv[a]); i++) {
            switch (argv[a][i]) {
                case 'q':
                    quiet = 1;
                    break;
                case 'c':
                    yajl_config(hand, yajl_allow_comments, 1);
                    break;
                case 'u':
                    yajl_config(hand, yajl_dont_validate_strings, 1);
                    break;
                case 's':
                    yajl_config(hand, yajl_allow_multiple_values, 1);
                    break;
                default:
                    fprintf(stderr, "unrecognized option: '%c'\n\n", argv[a][i]);
                    usage(argv[0]);
            }
        }
        ++a;
    }
    if (a < argc) {
        usage(argv[0]);
    }

    for (;;) {
        rd = fread((void *) fileData, 1, sizeof(fileData) - 1, stdin);

        retval = 0;

        if (rd == 0) {
            if (!feof(stdin)) {
                if (!quiet) {
                    fprintf(stderr, "error encountered on file read\n");
                }
                retval = 1;
            }
            break;
        }
        fileData[rd] = 0;

        /* read file data, pass to parser */
        stat = yajl_parse(hand, fileData, rd);

        if (stat != yajl_status_ok) break;
    }

    /* parse any remaining buffered data */
    stat = yajl_complete_parse(hand);

    if (stat != yajl_status_ok)
    {
        if (!quiet) {
            unsigned char * str = yajl_get_error(hand, 1, fileData, rd);
            fprintf(stderr, "%s", (const char *) str);
            yajl_free_error(hand, str);
        }
        retval = 1;
    }

    yajl_free(hand);

    if (!quiet) {
        printf("JSON is %s\n", retval ? "invalid" : "valid");
    }

    return retval;
}